

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

void __thiscall Fl_Help_View::leftline(Fl_Help_View *this,int left)

{
  int iVar1;
  int iVar2;
  int local_24;
  int local_14;
  int scrollsize;
  int left_local;
  Fl_Help_View *this_local;
  
  if (this->value_ != (char *)0x0) {
    if (this->scrollbar_size_ == 0) {
      local_24 = Fl::scrollbar_size();
    }
    else {
      local_24 = this->scrollbar_size_;
    }
    iVar1 = this->hsize_;
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    if ((iVar1 < iVar2 - local_24) || (left < 0)) {
      local_14 = 0;
    }
    else {
      local_14 = left;
      if (this->hsize_ < left) {
        local_14 = this->hsize_;
      }
    }
    this->leftline_ = local_14;
    iVar1 = this->leftline_;
    iVar2 = Fl_Widget::w((Fl_Widget *)this);
    Fl_Scrollbar::value(&this->hscrollbar_,iVar1,iVar2 - local_24,0,this->hsize_);
    Fl_Widget::redraw((Fl_Widget *)this);
  }
  return;
}

Assistant:

void
Fl_Help_View::leftline(int left)	// I - Left position
{
  if (!value_)
    return;

  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  if (hsize_ < (w() - scrollsize) || left < 0)
    left = 0;
  else if (left > hsize_)
    left = hsize_;

  leftline_ = left;

  hscrollbar_.value(leftline_, w() - scrollsize, 0, hsize_);

  redraw();
}